

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayGenericBinaryBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  undefined1 *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ClientContext *pCVar2;
  size_type sVar3;
  undefined8 uVar4;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var5;
  byte bVar6;
  byte bVar7;
  char cVar8;
  reference pvVar9;
  pointer pEVar10;
  pointer pEVar11;
  pointer pEVar12;
  reference pvVar13;
  idx_t index;
  idx_t index_00;
  LogicalType *pLVar14;
  LogicalType *pLVar15;
  InvalidInputException *this_01;
  ParameterNotResolvedException *this_02;
  BinderException *pBVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  LogicalType common_type;
  undefined1 local_180 [8];
  undefined8 local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_170;
  ScalarFunction *local_160;
  undefined8 local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_140;
  optional_idx local_138;
  optional_idx local_130;
  LogicalType local_128 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = context;
  local_140._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  bVar6 = (**(code **)(*(long *)pEVar10 + 0x30))(pEVar10);
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  params = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pEVar10;
  bVar7 = (*(code *)params[1].field_2._M_allocated_capacity)(pEVar10);
  if ((bVar6 & bVar7) == 1) {
    this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this_02);
    __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,std::runtime_error::~runtime_error)
    ;
  }
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  pEVar10 = pEVar11 + 0x38;
  if (bVar6 != 0) {
    pEVar10 = pEVar12 + 0x38;
  }
  this_00 = &bound_function->field_0x48;
  pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)this_00,0);
  if (pvVar13 != (reference)pEVar10) {
    *pvVar13 = (value_type)*pEVar10;
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)((ulong)params >> 8),pEVar10[1]);
    *(Expression *)(pvVar13 + 1) = pEVar10[1];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar13 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar10 + 8));
  }
  pEVar10 = pEVar12 + 0x38;
  if (bVar7 != 0) {
    pEVar10 = pEVar11 + 0x38;
  }
  pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)this_00,1);
  if (pvVar13 != (reference)pEVar10) {
    *pvVar13 = (value_type)*pEVar10;
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)((ulong)params >> 8),pEVar10[1]);
    *(Expression *)(pvVar13 + 1) = pEVar10[1];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar13 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar10 + 8));
  }
  pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)this_00,0);
  if (*pvVar13 == (value_type)0x6c) {
    pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                        ((vector<duckdb::LogicalType,_true> *)this_00,1);
    if (*pvVar13 == (value_type)0x6c) {
      local_160 = bound_function;
      pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_00,0);
      index = duckdb::ArrayType::GetSize(pvVar13);
      pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_00,1);
      index_00 = duckdb::ArrayType::GetSize(pvVar13);
      if (index != index_00) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        local_180 = (undefined1  [8])&aStack_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,"%s: Array arguments must be of the same size","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,*(long *)&local_160->field_0x8,
                   *(long *)&local_160->field_0x10 + *(long *)&local_160->field_0x8);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar16,(string *)local_180,&local_d0);
        __cxa_throw(pBVar16,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_00,0);
      pLVar14 = (LogicalType *)duckdb::ArrayType::GetChildType(pvVar13);
      pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_00,1);
      pLVar15 = (LogicalType *)duckdb::ArrayType::GetChildType(pvVar13);
      duckdb::LogicalType::LogicalType(local_128);
      cVar8 = duckdb::LogicalType::TryGetMaxLogicalType(local_158,pLVar14,pLVar15,local_128);
      if (cVar8 != '\0') {
        if (((byte)local_128[0] & 0xfe) == 0x16) {
          optional_idx::optional_idx(&local_130,index);
          duckdb::LogicalType::ARRAY((LogicalType *)local_180,(optional_idx)local_128);
          pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)this_00,0);
          uVar4 = aStack_170._M_allocated_capacity;
          sVar3 = local_178;
          *pvVar13 = local_180[0];
          pvVar13[1] = local_180[1];
          uVar17 = *(undefined4 *)(pvVar13 + 8);
          pCVar2 = *(ClientContext **)(pvVar13 + 8);
          uVar19 = *(undefined4 *)(pvVar13 + 0x10);
          *(undefined8 *)(pvVar13 + 8) = 0;
          *(undefined8 *)(pvVar13 + 0x10) = 0;
          local_178 = 0;
          aStack_170._M_allocated_capacity = 0;
          p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pvVar13 + 0x10);
          *(size_type *)(pvVar13 + 8) = sVar3;
          *(undefined8 *)(pvVar13 + 0x10) = uVar4;
          uVar18 = *(undefined4 *)(pvVar13 + 0xc);
          uVar20 = *(undefined4 *)(pvVar13 + 0x14);
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_158 = pCVar2;
            uStack_150 = uVar19;
            uStack_14c = *(undefined4 *)(pvVar13 + 0x14);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            uVar17 = (undefined4)local_158;
            uVar18 = local_158._4_4_;
            uVar19 = uStack_150;
            uVar20 = uStack_14c;
          }
          uVar4 = aStack_170._M_allocated_capacity;
          local_178 = CONCAT44(uVar18,uVar17);
          aStack_170._M_allocated_capacity._4_4_ = uVar20;
          aStack_170._M_allocated_capacity._0_4_ = uVar19;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
          }
          duckdb::LogicalType::~LogicalType((LogicalType *)local_180);
          optional_idx::optional_idx(&local_138,index_00);
          duckdb::LogicalType::ARRAY((LogicalType *)local_180,(optional_idx)local_128);
          pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)this_00,1);
          uVar4 = aStack_170._M_allocated_capacity;
          sVar3 = local_178;
          *pvVar13 = local_180[0];
          pvVar13[1] = local_180[1];
          uVar17 = *(undefined4 *)(pvVar13 + 8);
          pCVar2 = *(ClientContext **)(pvVar13 + 8);
          uVar19 = *(undefined4 *)(pvVar13 + 0x10);
          *(undefined8 *)(pvVar13 + 8) = 0;
          *(undefined8 *)(pvVar13 + 0x10) = 0;
          local_178 = 0;
          aStack_170._M_allocated_capacity = 0;
          p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pvVar13 + 0x10);
          *(size_type *)(pvVar13 + 8) = sVar3;
          *(undefined8 *)(pvVar13 + 0x10) = uVar4;
          uVar18 = *(undefined4 *)(pvVar13 + 0xc);
          uVar20 = *(undefined4 *)(pvVar13 + 0x14);
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_158 = pCVar2;
            uStack_150 = uVar19;
            uStack_14c = *(undefined4 *)(pvVar13 + 0x14);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            uVar17 = (undefined4)local_158;
            uVar18 = local_158._4_4_;
            uVar19 = uStack_150;
            uVar20 = uStack_14c;
          }
          uVar4 = aStack_170._M_allocated_capacity;
          local_178 = CONCAT44(uVar18,uVar17);
          aStack_170._M_allocated_capacity._4_4_ = uVar20;
          aStack_170._M_allocated_capacity._0_4_ = uVar19;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
          }
          duckdb::LogicalType::~LogicalType((LogicalType *)local_180);
          _Var5._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
          .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
               local_140._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
          *(undefined8 *)
           local_140._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = 0;
          duckdb::LogicalType::~LogicalType(local_128);
          return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                 (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                  )_Var5._M_t.
                   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                   .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
        }
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        local_180 = (undefined1  [8])&aStack_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,"%s: Arguments must be arrays of FLOAT or DOUBLE","");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,*(long *)&local_160->field_0x8,
                   *(long *)&local_160->field_0x10 + *(long *)&local_160->field_0x8);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar16,(string *)local_180,&local_110);
        __cxa_throw(pBVar16,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      local_180 = (undefined1  [8])&aStack_170;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,
                 "%s: Cannot infer common element type (left = \'%s\', right = \'%s\')","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,*(long *)&local_160->field_0x8,
                 *(long *)&local_160->field_0x10 + *(long *)&local_160->field_0x8);
      duckdb::LogicalType::ToString_abi_cxx11_();
      duckdb::LogicalType::ToString_abi_cxx11_();
      BinderException::
      BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (pBVar16,(string *)local_180,&local_f0,&local_50,&local_70);
      __cxa_throw(pBVar16,&BinderException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"%s: Arguments must be arrays of FLOAT or DOUBLE","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,*(long *)&bound_function->field_0x8,
             *(long *)&bound_function->field_0x10 + *(long *)&bound_function->field_0x8);
  StringUtil::Format<std::__cxx11::string>
            ((string *)local_180,(StringUtil *)local_90,&local_b0,params);
  duckdb::InvalidInputException::InvalidInputException(this_01,(string *)local_180);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ArrayGenericBinaryBind(ClientContext &context, ScalarFunction &bound_function,
                                                       vector<unique_ptr<Expression>> &arguments) {

	const auto lhs_is_param = arguments[0]->HasParameter();
	const auto rhs_is_param = arguments[1]->HasParameter();

	if (lhs_is_param && rhs_is_param) {
		throw ParameterNotResolvedException();
	}

	const auto &lhs_type = arguments[0]->return_type;
	const auto &rhs_type = arguments[1]->return_type;

	bound_function.arguments[0] = lhs_is_param ? rhs_type : lhs_type;
	bound_function.arguments[1] = rhs_is_param ? lhs_type : rhs_type;

	if (bound_function.arguments[0].id() != LogicalTypeId::ARRAY ||
	    bound_function.arguments[1].id() != LogicalTypeId::ARRAY) {
		throw InvalidInputException(
		    StringUtil::Format("%s: Arguments must be arrays of FLOAT or DOUBLE", bound_function.name));
	}

	const auto lhs_size = ArrayType::GetSize(bound_function.arguments[0]);
	const auto rhs_size = ArrayType::GetSize(bound_function.arguments[1]);

	if (lhs_size != rhs_size) {
		throw BinderException("%s: Array arguments must be of the same size", bound_function.name);
	}

	const auto &lhs_element_type = ArrayType::GetChildType(bound_function.arguments[0]);
	const auto &rhs_element_type = ArrayType::GetChildType(bound_function.arguments[1]);

	// Resolve common type
	LogicalType common_type;
	if (!LogicalType::TryGetMaxLogicalType(context, lhs_element_type, rhs_element_type, common_type)) {
		throw BinderException("%s: Cannot infer common element type (left = '%s', right = '%s')", bound_function.name,
		                      lhs_element_type.ToString(), rhs_element_type.ToString());
	}

	// Ensure it is float or double
	if (common_type.id() != LogicalTypeId::FLOAT && common_type.id() != LogicalTypeId::DOUBLE) {
		throw BinderException("%s: Arguments must be arrays of FLOAT or DOUBLE", bound_function.name);
	}

	// The important part is just that we resolve the size of the input arrays
	bound_function.arguments[0] = LogicalType::ARRAY(common_type, lhs_size);
	bound_function.arguments[1] = LogicalType::ARRAY(common_type, rhs_size);

	return nullptr;
}